

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_scatter.cpp
# Opt level: O2

void duckdb::HeapScatterListVector
               (Vector *v,idx_t vcount,SelectionVector *sel,idx_t ser_count,
               data_ptr_t *key_locations,optional_ptr<duckdb::NestedValidity,_true> parent_validity,
               idx_t offset)

{
  PhysicalType type;
  long lVar1;
  bool bVar2;
  list_entry_t *plVar3;
  Vector *this;
  idx_t iVar4;
  LogicalType *pLVar5;
  idx_t iVar6;
  ulong uVar7;
  idx_t iVar8;
  long lVar9;
  SelectionVector *pSVar10;
  NestedValidity *this_00;
  ulong uVar11;
  data_ptr_t pdVar12;
  uint64_t uVar13;
  ulong uVar14;
  idx_t iVar15;
  long lVar16;
  byte *__s;
  idx_t i;
  idx_t local_8118;
  data_ptr_t local_8108;
  undefined4 local_80fc;
  optional_ptr<duckdb::NestedValidity,_true> parent_validity_local;
  UnifiedVectorFormat list_vdata;
  UnifiedVectorFormat vdata;
  data_ptr_t list_entry_locations [2048];
  idx_t list_entry_sizes [2048];
  
  parent_validity_local = parent_validity;
  UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
  Vector::ToUnifiedFormat(v,vcount,&vdata);
  plVar3 = ListVector::GetData(v);
  this = ListVector::GetEntry(v);
  UnifiedVectorFormat::UnifiedVectorFormat(&list_vdata);
  iVar4 = ListVector::GetListSize(v);
  Vector::ToUnifiedFormat(this,iVar4,&list_vdata);
  pLVar5 = ListType::GetChildType(&v->type);
  type = pLVar5->physical_type_;
  for (iVar4 = 0; iVar4 != ser_count; iVar4 = iVar4 + 1) {
    iVar6 = iVar4;
    if (sel->sel_vector != (sel_t *)0x0) {
      iVar6 = (idx_t)sel->sel_vector[iVar4];
    }
    uVar7 = iVar6 + offset;
    if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
      uVar7 = (ulong)(vdata.sel)->sel_vector[uVar7];
    }
    if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6] >>
         (uVar7 & 0x3f) & 1) != 0)) {
      local_8118 = plVar3[uVar7].offset;
      uVar13 = plVar3[uVar7].length;
      *(uint64_t *)key_locations[iVar4] = uVar13;
      __s = key_locations[iVar4] + 8;
      key_locations[iVar4] = __s;
      uVar7 = uVar13 + 7 >> 3;
      switchD_016d8eb1::default(__s,0xff,uVar7);
      key_locations[iVar4] = key_locations[iVar4] + uVar7;
      bVar2 = TypeIsConstantSize(type);
      if (bVar2) {
        local_8108 = (data_ptr_t)0x0;
      }
      else {
        local_8108 = key_locations[iVar4];
        key_locations[iVar4] = local_8108 + uVar13 * 8;
      }
      lVar16 = 0;
      for (; uVar13 != 0; uVar13 = uVar13 - iVar6) {
        uVar7 = local_8118;
        uVar14 = 0x800;
        iVar6 = 0x800;
        if (uVar13 < 0x800) {
          uVar14 = uVar13;
          iVar6 = uVar13;
        }
        while (uVar14 != 0) {
          uVar11 = uVar7;
          if ((list_vdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar11 = (ulong)(list_vdata.sel)->sel_vector[uVar7];
          }
          if ((list_vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
               (unsigned_long *)0x0) &&
             ((list_vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0)) {
            *__s = *__s & ~(byte)(1L << ((byte)lVar16 & 0x3f));
          }
          lVar16 = lVar16 + 1;
          bVar2 = lVar16 == 8;
          if (bVar2) {
            lVar16 = 0;
          }
          __s = __s + bVar2;
          uVar7 = uVar7 + 1;
          uVar14 = uVar14 - 1;
        }
        bVar2 = TypeIsConstantSize(type);
        if (bVar2) {
          iVar8 = GetTypeIdSize(type);
          pdVar12 = key_locations[iVar4];
          for (iVar15 = 0; iVar6 != iVar15; iVar15 = iVar15 + 1) {
            list_entry_locations[iVar15] = pdVar12;
            pdVar12 = pdVar12 + iVar8;
          }
          key_locations[iVar4] = pdVar12;
        }
        else {
          local_80fc = 0;
          ::std::__fill_n_a<unsigned_long*,unsigned_long,int>(list_entry_sizes,iVar6,&local_80fc);
          pSVar10 = FlatVector::IncrementalSelectionVector();
          RowOperations::ComputeEntrySizes(this,list_entry_sizes,iVar6,iVar6,pSVar10,local_8118);
          for (lVar9 = 0; iVar6 * 8 - lVar9 != 0; lVar9 = lVar9 + 8) {
            pdVar12 = key_locations[iVar4];
            *(data_ptr_t *)((long)list_entry_locations + lVar9) = pdVar12;
            lVar1 = *(long *)((long)list_entry_sizes + lVar9);
            key_locations[iVar4] = pdVar12 + lVar1;
            *(long *)(local_8108 + lVar9) = lVar1;
          }
          local_8108 = local_8108 + lVar9;
        }
        iVar8 = ListVector::GetListSize(v);
        pSVar10 = FlatVector::IncrementalSelectionVector();
        RowOperations::HeapScatter
                  (this,iVar8,pSVar10,iVar6,list_entry_locations,
                   (optional_ptr<duckdb::NestedValidity,_true>)0x0,local_8118);
        local_8118 = local_8118 + iVar6;
      }
    }
    else if (parent_validity_local.ptr != (NestedValidity *)0x0) {
      this_00 = optional_ptr<duckdb::NestedValidity,_true>::operator->(&parent_validity_local);
      NestedValidity::SetInvalid(this_00,iVar4);
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&list_vdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
  return;
}

Assistant:

static void HeapScatterListVector(Vector &v, idx_t vcount, const SelectionVector &sel, idx_t ser_count,
                                  data_ptr_t *key_locations, optional_ptr<NestedValidity> parent_validity,
                                  idx_t offset) {
	UnifiedVectorFormat vdata;
	v.ToUnifiedFormat(vcount, vdata);

	auto list_data = ListVector::GetData(v);
	auto &child_vector = ListVector::GetEntry(v);

	UnifiedVectorFormat list_vdata;
	child_vector.ToUnifiedFormat(ListVector::GetListSize(v), list_vdata);
	auto child_type = ListType::GetChildType(v.GetType()).InternalType();

	idx_t list_entry_sizes[STANDARD_VECTOR_SIZE];
	data_ptr_t list_entry_locations[STANDARD_VECTOR_SIZE];

	for (idx_t i = 0; i < ser_count; i++) {
		auto idx = sel.get_index(i);
		auto source_idx = vdata.sel->get_index(idx + offset);
		if (!vdata.validity.RowIsValid(source_idx)) {
			if (parent_validity) {
				// set the row validitymask for this column to invalid
				parent_validity->SetInvalid(i);
			}
			continue;
		}
		auto list_entry = list_data[source_idx];

		// store list length
		Store<uint64_t>(list_entry.length, key_locations[i]);
		key_locations[i] += sizeof(list_entry.length);

		// make room for the validitymask
		data_ptr_t list_validitymask_location = key_locations[i];
		idx_t entry_offset_in_byte = 0;
		idx_t validitymask_size = (list_entry.length + 7) / 8;
		memset(list_validitymask_location, -1, validitymask_size);
		key_locations[i] += validitymask_size;

		// serialize size of each entry (if non-constant size)
		data_ptr_t var_entry_size_ptr = nullptr;
		if (!TypeIsConstantSize(child_type)) {
			var_entry_size_ptr = key_locations[i];
			key_locations[i] += list_entry.length * sizeof(idx_t);
		}

		auto entry_remaining = list_entry.length;
		auto entry_offset = list_entry.offset;
		while (entry_remaining > 0) {
			// the list entry can span multiple vectors
			auto next = MinValue((idx_t)STANDARD_VECTOR_SIZE, entry_remaining);

			// serialize list validity
			for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
				auto list_idx = list_vdata.sel->get_index(entry_idx + entry_offset);
				if (!list_vdata.validity.RowIsValid(list_idx)) {
					*(list_validitymask_location) &= ~(1UL << entry_offset_in_byte);
				}
				if (++entry_offset_in_byte == 8) {
					list_validitymask_location++;
					entry_offset_in_byte = 0;
				}
			}

			if (TypeIsConstantSize(child_type)) {
				// constant size list entries: set list entry locations
				const idx_t type_size = GetTypeIdSize(child_type);
				for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
					list_entry_locations[entry_idx] = key_locations[i];
					key_locations[i] += type_size;
				}
			} else {
				// variable size list entries: compute entry sizes and set list entry locations
				std::fill_n(list_entry_sizes, next, 0);
				RowOperations::ComputeEntrySizes(child_vector, list_entry_sizes, next, next,
				                                 *FlatVector::IncrementalSelectionVector(), entry_offset);
				for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
					list_entry_locations[entry_idx] = key_locations[i];
					key_locations[i] += list_entry_sizes[entry_idx];
					Store<idx_t>(list_entry_sizes[entry_idx], var_entry_size_ptr);
					var_entry_size_ptr += sizeof(idx_t);
				}
			}

			// now serialize to the locations
			RowOperations::HeapScatter(child_vector, ListVector::GetListSize(v),
			                           *FlatVector::IncrementalSelectionVector(), next, list_entry_locations, nullptr,
			                           entry_offset);

			// update for next iteration
			entry_remaining -= next;
			entry_offset += next;
		}
	}
}